

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast2json.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  string_view filename;
  char *pcVar1;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> script_00;
  Result RVar2;
  char *pcVar3;
  size_t sVar4;
  Callback *callback;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  uint uVar5;
  pointer pFVar6;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view filename_04;
  string_view sVar7;
  string_view source_filename;
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  code *pcVar8;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> script;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  Errors errors;
  vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
  module_streams;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  OptionParser parser;
  WastParseOptions parse_wast_options;
  string_view local_40;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            (&parser,"wast2json",
             "  read a file in the wasm spec test format, check it for errors, and\n  convert it to a JSON file and associated wasm binary files.\n\nexamples:\n  # parse spec-test.wast, and write files to spec-test.json. Modules are\n  # written to spec-test.0.wasm, spec-test.1.wasm, etc.\n  $ wast2json spec-test.wast -o spec-test.json\n"
            );
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar8 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:64:72)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'v',"verbose","Use multiple times for more info",(NullCallback *)&line_finder);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&line_finder,&line_finder,3);
  }
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar8 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:69:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"debug-parser","Turn on debugging the parser of wast files",
             (NullCallback *)&line_finder);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&line_finder,&line_finder,3);
  }
  wabt::Features::AddOptions(&s_features,&parser);
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar8 = std::
           _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:72:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'o',"output","FILE","output JSON file",(Callback *)&line_finder);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&line_finder,&line_finder,3);
  }
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar8 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:76:7)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'r',"relocatable",
             "Create a relocatable wasm binary (suitable for linking with e.g. lld)",
             (NullCallback *)&line_finder);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&line_finder,&line_finder,3);
  }
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar8 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:80:7)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"no-canonicalize-leb128s",
             "Write all LEB128 sizes as 5-bytes instead of their minimal size",
             (NullCallback *)&line_finder);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&line_finder,&line_finder,3);
  }
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar8 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:83:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"debug-names","Write debug names to the generated binary file",
             (NullCallback *)&line_finder);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&line_finder,&line_finder,3);
  }
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar8 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:85:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"no-check","Don\'t check for invalid modules",(NullCallback *)&line_finder);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&line_finder,&line_finder,3);
  }
  std::__cxx11::string::string((string *)&line_finder,"filename",(allocator *)&errors);
  callback = (Callback *)&file_data;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:87:22)>
                ::_M_manager;
  wabt::OptionParser::AddArgument(&parser,(string *)&line_finder,One,callback);
  if (file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&file_data,&file_data,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  wabt::OptionParser::~OptionParser(&parser);
  pcVar1 = s_infile;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = (char *)strlen(s_infile);
  filename_00.size_ = (size_type)&file_data;
  filename_00.data_ = pcVar3;
  RVar2 = wabt::ReadFile((wabt *)pcVar1,filename_00,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  strlen(s_infile);
  sVar7.size_ = (size_type)
                script._M_t.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>.
                _M_t.super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl;
  sVar7.data_ = (char *)std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:85:20)>
                        ::_M_invoke;
  wabt::WastLexer::CreateBufferLexer(sVar7,pcVar8,line_finder._8_8_);
  if (RVar2.enum_ == Error) {
    fprintf(_stderr,"unable to read file: %s\n",s_infile);
    exit(1);
  }
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  script._M_t.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
  super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true>)
       (__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parse_wast_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
  parse_wast_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
  parse_wast_options.features.annotations_enabled_ = s_features.annotations_enabled_;
  parse_wast_options.features.gc_enabled_ = s_features.gc_enabled_;
  parse_wast_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
  parse_wast_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
  parse_wast_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
  parse_wast_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
  parse_wast_options.features.simd_enabled_ = s_features.simd_enabled_;
  parse_wast_options.features.threads_enabled_ = s_features.threads_enabled_;
  parse_wast_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
  parse_wast_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
  parse_wast_options.debug_parsing = false;
  RVar2 = wabt::ParseWastScript
                    ((WastLexer *)
                     lexer._M_t.
                     super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                     .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,&script,&errors,
                     &parse_wast_options);
  uVar5 = 1;
  if (RVar2.enum_ == Ok) {
    if (s_validate == '\0') {
      parser.program_name_._M_string_length =
           CONCAT44(parser.program_name_._M_string_length._4_4_,s_features._8_4_);
      parser.program_name_._M_dataplus._M_p = (pointer)s_features._0_8_;
      RVar2 = wabt::ValidateScript
                        ((Script *)
                         script._M_t.
                         super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                         super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,&errors,
                         (ValidateOptions *)&parser);
      if (RVar2.enum_ != Ok) goto LAB_0015eb20;
    }
    pcVar1 = s_infile;
    if (s_outfile_abi_cxx11_._M_string_length == 0) {
      pcVar3 = (char *)strlen(s_infile);
      filename_01.size_ = extraout_RDX;
      filename_01.data_ = pcVar3;
      sVar7 = wabt::GetBasename((wabt *)pcVar1,filename_01);
      filename_02.size_ = (char *)sVar7.size_;
      filename_02.data_ = filename_02.size_;
      _line_finder = (_Any_data)wabt::StripExtension((wabt *)sVar7.data_,filename_02);
      wabt::string_view::operator_cast_to_string(&parser.program_name_,(string_view *)&line_finder);
      std::__cxx11::string::append((char *)&parser);
      std::__cxx11::string::operator=((string *)&s_outfile_abi_cxx11_,(string *)&parser);
      std::__cxx11::string::_M_dispose();
    }
    module_streams.
    super__Vector_base<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    module_streams.
    super__Vector_base<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    module_streams.
    super__Vector_base<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wabt::MemoryStream::MemoryStream((MemoryStream *)&parser,(Stream *)0x0);
    filename_03.size_ = extraout_RDX_00;
    filename_03.data_ = (char *)s_outfile_abi_cxx11_._M_string_length;
    local_40 = wabt::StripExtension((wabt *)s_outfile_abi_cxx11_._M_dataplus._M_p,filename_03);
    wabt::string_view::to_string_abi_cxx11_((string *)&line_finder,&local_40);
    script_00 = script;
    pcVar1 = s_infile;
    s_write_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    s_write_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    s_write_binary_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_
    ;
    s_write_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    s_write_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
    s_write_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
    s_write_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    s_write_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    s_write_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    s_write_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    s_write_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
    s_write_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
    sVar4 = strlen(s_infile);
    source_filename.size_ = sVar4;
    source_filename.data_ = pcVar1;
    RVar2 = wabt::WriteBinarySpecScript
                      ((Stream *)&parser,
                       (Script *)
                       script_00._M_t.
                       super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                       super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,source_filename,
                       (string_view)_line_finder,&s_write_binary_options,&module_streams,
                       (Stream *)
                       s_log_stream._M_t.
                       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                       .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
    filename_04.size_ = s_outfile_abi_cxx11_._M_string_length;
    filename_04.data_ = s_outfile_abi_cxx11_._M_dataplus._M_p;
    wabt::OutputBuffer::WriteToFile
              ((OutputBuffer *)parser.description_._M_dataplus._M_p,filename_04);
    for (pFVar6 = module_streams.
                  super__Vector_base<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pFVar6 != module_streams.
                  super__Vector_base<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pFVar6 = pFVar6 + 1) {
      filename.data_ = (pFVar6->filename)._M_dataplus._M_p;
      filename.size_ = (pFVar6->filename)._M_string_length;
      wabt::MemoryStream::WriteToFile
                ((pFVar6->stream)._M_t.
                 super___uniq_ptr_impl<wabt::MemoryStream,_std::default_delete<wabt::MemoryStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::MemoryStream_*,_std::default_delete<wabt::MemoryStream>_>
                 .super__Head_base<0UL,_wabt::MemoryStream_*,_false>._M_head_impl,filename);
    }
    std::__cxx11::string::_M_dispose();
    wabt::MemoryStream::~MemoryStream((MemoryStream *)&parser);
    std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>::
    ~vector(&module_streams);
    uVar5 = (uint)(RVar2.enum_ != Ok);
  }
LAB_0015eb20:
  wabt::WastLexer::MakeLineFinder((WastLexer *)&line_finder);
  parser.program_name_._M_dataplus._M_p = (pointer)&parser.program_name_.field_2;
  parser.program_name_._M_string_length = 0;
  parser.program_name_.field_2._M_local_buf[0] = '\0';
  wabt::FormatErrorsToFile
            (&errors,Text,
             (LexerSourceLineFinder *)
             line_finder._M_t.
             super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
             .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl,
             (FILE *)_stderr,&parser.program_name_,Never,0x50);
  std::__cxx11::string::_M_dispose();
  std::unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
  ~unique_ptr(&line_finder);
  std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::~unique_ptr(&script);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&lexer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar5;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      s_infile, file_data.data(), file_data.size());
  if (Failed(result)) {
    WABT_FATAL("unable to read file: %s\n", s_infile);
  }

  Errors errors;
  std::unique_ptr<Script> script;
  WastParseOptions parse_wast_options(s_features);
  result = ParseWastScript(lexer.get(), &script, &errors, &parse_wast_options);

  if (Succeeded(result) && s_validate) {
    ValidateOptions options(s_features);
    result = ValidateScript(script.get(), &errors, options);
  }

  if (Succeeded(result)) {
    if (s_outfile.empty()) {
      s_outfile = DefaultOuputName(s_infile);
    }

    std::vector<FilenameMemoryStreamPair> module_streams;
    MemoryStream json_stream;

    std::string output_basename = StripExtension(s_outfile).to_string();
    s_write_binary_options.features = s_features;
    result = WriteBinarySpecScript(&json_stream, script.get(), s_infile,
                                   output_basename, s_write_binary_options,
                                   &module_streams, s_log_stream.get());

    json_stream.WriteToFile(s_outfile);

    for (auto iter = module_streams.begin(); iter != module_streams.end();
         ++iter) {
      iter->stream->WriteToFile(iter->filename);
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get());

  return result != Result::Ok;
}